

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Camera::readFrom(Camera *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  anon_struct_72_6_54767870_for_simplified *in_RDI;
  
  BinaryReader::read<float,void>(in_RSI,(float *)in_RDI);
  BinaryReader::read<float,void>(in_RSI,(float *)in_RDI);
  BinaryReader::read<float,void>(in_RSI,(float *)in_RDI);
  BinaryReader::read<pbrt::math::affine3f,void>(in_RSI,(affine3f *)in_RDI);
  BinaryReader::read<pbrt::Camera::_unnamed_type_1_,void>(in_RSI,in_RDI);
  return;
}

Assistant:

void Camera::readFrom(BinaryReader &binary) 
  {
    binary.read(fov);
    binary.read(focalDistance);
    binary.read(lensRadius);
    binary.read(frame);
    binary.read(simplified);
  }